

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O0

int main(int argc,char **argv)

{
  dropt_error dVar1;
  char *local_88;
  long *local_68;
  dropt_char **arg;
  dropt_help_params helpParams;
  bool success;
  dropt_context *droptContext;
  dropt_char **rest;
  char **argv_local;
  int argc_local;
  
  stack0xffffffffffffffb0 = (dropt_context *)0x0;
  helpParams.description_start_column = test_strings();
  if (helpParams.description_start_column == false) {
    helpParams.description_start_column = 0;
  }
  else {
    register0x00000000 = (dropt_context *)dropt_new_context(options);
    if (register0x00000000 == (dropt_context *)0x0) {
      fputs("Insufficient memory.\n",_stderr);
      helpParams.description_start_column = 0;
    }
    else {
      helpParams.description_start_column = test_dropt_handlers(register0x00000000);
      if (helpParams.description_start_column == false) {
        helpParams.description_start_column = 0;
      }
      else {
        dropt_set_error_handler(stack0xffffffffffffffb0,my_dropt_error_handler,0);
        init_option_defaults();
        helpParams.description_start_column = test_dropt_parse(stack0xffffffffffffffb0);
        if (helpParams.description_start_column != false) {
          init_option_defaults();
          dropt_allow_concatenated_arguments(stack0xffffffffffffffb0,allowConcatenatedArgs);
          local_68 = (long *)dropt_parse(stack0xffffffffffffffb0,0xffffffff,argv + 1);
          dVar1 = get_and_print_dropt_error(stack0xffffffffffffffb0);
          if (dVar1 != 0) {
            fputc(10,_stdout);
          }
          if (showHelp == '\0') {
            if ((1 < argc) && (quiet == '\0')) {
              if (stringVal == (dropt_char *)0x0) {
                local_88 = "(null)";
              }
              else {
                local_88 = stringVal;
              }
              fprintf(_stdout,
                      "Compilation flags: %s%s%s\nnormalFlag: %u\nrequiredArgFlag: %u\nhiddenFlag: %u\nstring: %s\nintVal: %d\noptionalUInt: %u, value: %u\nipAddress: %u.%u.%u.%u (%u)\ntristate: %d\n\n"
                      ,"","","",(ulong)normalFlag,(uint)requiredArgFlag,(uint)hiddenFlag,local_88,
                      intVal,optionalUInt.is_set,optionalUInt.value,ipAddress >> 0x18,
                      ipAddress >> 0x10 & 0xff,ipAddress >> 8 & 0xff,ipAddress & 0xff,ipAddress,
                      triVal);
              fprintf(_stdout,"Rest:");
              for (; *local_68 != 0; local_68 = local_68 + 1) {
                fprintf(_stdout," %s",*local_68);
              }
              fputc(10,_stdout);
            }
          }
          else {
            fputs("Usage: test_dropt [options] [--] [operands]\n\n",_stdout);
            dropt_init_help_params(&arg);
            arg._4_4_ = 0x1e;
            helpParams.indent._0_1_ = 0;
            dropt_print_help(_stdout,stack0xffffffffffffffb0,&arg);
          }
        }
      }
    }
  }
  dropt_free_context(stack0xffffffffffffffb0);
  if (helpParams.description_start_column == 0) {
    fputs("One or more tests failed.\n",_stderr);
  }
  return (uint)(helpParams.description_start_column == 0);
}

Assistant:

int
main(int argc, char** argv)
#endif
{
    dropt_char** rest;
    dropt_context* droptContext = NULL;

    bool success = test_strings();
    if (!success) { goto exit; }

    droptContext = dropt_new_context(options);
    if (droptContext == NULL)
    {
        fputts(T("Insufficient memory.\n"), stderr);
        success = false;
        goto exit;
    }

    success = test_dropt_handlers(droptContext);
    if (!success) { goto exit; }

    dropt_set_error_handler(droptContext, my_dropt_error_handler, NULL);

    init_option_defaults();
    success = test_dropt_parse(droptContext);
    if (!success) { goto exit; }

    init_option_defaults();
    dropt_allow_concatenated_arguments(droptContext, allowConcatenatedArgs);
    rest = dropt_parse(droptContext, -1, &argv[1]);

    /* Most programs normally should abort if given invalid arguments, but
     * for diagnostic purposes, this test program presses on anyway.
     */
    if (get_and_print_dropt_error(droptContext) != dropt_error_none)
    {
        fputtc(T('\n'), stdout);
    }

    if (showHelp)
    {
        fputts(T("Usage: test_dropt [options] [--] [operands]\n\n"), stdout);
#ifndef DROPT_NO_STRING_BUFFERS
        {
            dropt_help_params helpParams;
            dropt_init_help_params(&helpParams);
            helpParams.description_start_column = 30;
            helpParams.blank_lines_between_options = false;
            dropt_print_help(stdout, droptContext, &helpParams);
        }
#endif
        goto exit;
    }

    if (argc > 1 && !quiet)
    {
        dropt_char** arg;

        ftprintf(stdout, T("Compilation flags: %s%s%s\n")
                         T("normalFlag: %u\n")
                         T("requiredArgFlag: %u\n")
                         T("hiddenFlag: %u\n")
                         T("string: %s\n")
                         T("intVal: %d\n")
                         T("optionalUInt: %u, value: %u\n")
                         T("ipAddress: %u.%u.%u.%u (%u)\n")
                         T("tristate: %d\n")
                         T("\n"),
#ifdef NDEBUG
                 T("NDEBUG "),
#else
                 T(""),
#endif
#ifdef DROPT_NO_STRING_BUFFERS
                 T("DROPT_NO_STRING_BUFFERS "),
#else
                 T(""),
#endif
#ifdef DROPT_USE_WCHAR
                 T("DROPT_USE_WCHAR "),
#else
                 T(""),
#endif
                 normalFlag, requiredArgFlag, hiddenFlag,
                 (stringVal == NULL) ? T("(null)") : stringVal,
                 intVal, optionalUInt.is_set, optionalUInt.value,
                 (ipAddress >> 24) & 0xFF,
                 (ipAddress >> 16) & 0xFF,
                 (ipAddress >> 8) & 0xFF,
                 ipAddress & 0xFF,
                 ipAddress,
                 triVal);
        ftprintf(stdout, T("Rest:"));
        for (arg = rest; *arg != NULL; arg++)
        {
            ftprintf(stdout, T(" %s"), *arg);
        }
        fputtc(T('\n'), stdout);
    }

exit:
    dropt_free_context(droptContext);

    if (!success) { fputts(T("One or more tests failed.\n"), stderr); }
    return success ? EXIT_SUCCESS : EXIT_FAILURE;
}